

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_ReaderCloseHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  long *plVar1;
  undefined8 *in_RDX;
  WS_ReaderInfo CP_WSR_Stream;
  _ReaderCloseMsg *Msg;
  char *tmpstr;
  StreamStatus NewState;
  WS_ReaderInfo in_stack_ffffffffffffffd0;
  
  if (_perfstubs_initialized == 1) {
    if (CP_ReaderCloseHandler::timer == (void *)0x0) {
      in_stack_ffffffffffffffd0 =
           (WS_ReaderInfo)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                               ,"CP_ReaderCloseHandler",0x972);
      CP_ReaderCloseHandler::timer = (void *)ps_timer_create_(in_stack_ffffffffffffffd0);
      free(in_stack_ffffffffffffffd0);
    }
    ps_timer_start_(CP_ReaderCloseHandler::timer);
  }
  plVar1 = (long *)*in_RDX;
  pthread_mutex_lock((pthread_mutex_t *)(*plVar1 + 0xc0));
  NewState = (StreamStatus)((ulong)in_RDX >> 0x20);
  if ((*plVar1 == 0) || (*(int *)(*plVar1 + 0x210) != 2)) {
    pthread_mutex_unlock((pthread_mutex_t *)(*plVar1 + 0xc0));
  }
  else {
    CP_verbose((SstStream)*plVar1,PerStepVerbose,
               "Reader Close message received for stream %p.  Setting state to PeerClosed and releasing timesteps.\n"
               ,plVar1);
    CP_PeerFailCloseWSReader(in_stack_ffffffffffffffd0,NewState);
    pthread_mutex_unlock((pthread_mutex_t *)(*plVar1 + 0xc0));
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(CP_ReaderCloseHandler::timer);
    }
  }
  return;
}

Assistant:

void CP_ReaderCloseHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                           attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    struct _ReaderCloseMsg *Msg = (struct _ReaderCloseMsg *)Msg_v;

    WS_ReaderInfo CP_WSR_Stream = Msg->WSR_Stream;
    STREAM_MUTEX_LOCK(CP_WSR_Stream->ParentStream);
    if ((CP_WSR_Stream->ParentStream == NULL) ||
        (CP_WSR_Stream->ParentStream->Status != Established))
    {
        STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
        return;
    }

    CP_verbose(CP_WSR_Stream->ParentStream, PerStepVerbose,
               "Reader Close message received for stream %p.  Setting state to "
               "PeerClosed and releasing timesteps.\n",
               CP_WSR_Stream);
    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerClosed);
    STREAM_MUTEX_UNLOCK(CP_WSR_Stream->ParentStream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}